

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

void jsoncons::detail::fill_exponent<jsoncons::stream_sink<char>>(int K,stream_sink<char> *result)

{
  ushort uVar1;
  byte bVar2;
  
  if (K < 0) {
    stream_sink<char>::push_back(result,'-');
    K = -K;
  }
  else {
    stream_sink<char>::push_back(result,'+');
  }
  bVar2 = (byte)K;
  if ((uint)K < 10) {
    stream_sink<char>::push_back(result,'0');
  }
  else {
    if ((uint)K < 100) {
      uVar1 = (ushort)K & 0xff;
    }
    else {
      if (999 < (uint)K) {
        from_integer<int,jsoncons::stream_sink<char>>(K,result);
        return;
      }
      stream_sink<char>::push_back(result,(byte)((K & 0xffffU) / 100) | 0x30);
      uVar1 = (ushort)((K & 0xffffU) % 100);
    }
    bVar2 = (byte)(uVar1 % 10);
    stream_sink<char>::push_back(result,(byte)(uVar1 / 10) | 0x30);
  }
  stream_sink<char>::push_back(result,bVar2 | 0x30);
  return;
}

Assistant:

void fill_exponent(int K, Result& result)
    {
        if (K < 0)
        {
            result.push_back('-');
            K = -K;
        }
        else
        {
            result.push_back('+'); // compatibility with sprintf
        }

        if (K < 10)
        {
            result.push_back('0'); // compatibility with sprintf
            result.push_back((char)('0' + K));
        }
        else if (K < 100)
        {
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else if (K < 1000)
        {
            result.push_back((char)('0' + K / 100)); K %= 100;
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else
        {
            jsoncons::detail::from_integer(K, result);
        }
    }